

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBlendTests.cpp
# Opt level: O0

void deqp::gles3::Functional::sRGBAToLinear(PixelBufferAccess *dst,ConstPixelBufferAccess *src)

{
  ConstPixelBufferAccess *this;
  undefined1 local_48 [16];
  Vec4 local_38;
  int local_28;
  int local_24;
  int x;
  int y;
  int height;
  int width;
  ConstPixelBufferAccess *src_local;
  PixelBufferAccess *dst_local;
  
  _height = src;
  src_local = &dst->super_ConstPixelBufferAccess;
  y = tcu::ConstPixelBufferAccess::getWidth(src);
  x = tcu::ConstPixelBufferAccess::getHeight(_height);
  for (local_24 = 0; local_24 < x; local_24 = local_24 + 1) {
    for (local_28 = 0; this = src_local, local_28 < y; local_28 = local_28 + 1) {
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_48,(int)_height,local_28,local_24);
      tcu::sRGBToLinear((tcu *)&local_38,(Vec4 *)local_48);
      tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)this,&local_38,local_28,local_24,0);
    }
  }
  return;
}

Assistant:

static void sRGBAToLinear (const tcu::PixelBufferAccess& dst, const tcu::ConstPixelBufferAccess& src)
{
	const int	width	= src.getWidth();
	const int	height	= src.getHeight();

	for (int y = 0; y < height; y++)
	for (int x = 0; x < width; x++)
		dst.setPixel(tcu::sRGBToLinear(src.getPixel(x, y)), x, y);
}